

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O1

void __thiscall Nes_Namco::Nes_Namco(Nes_Namco *this)

{
  Blip_Impulse_ *this_00;
  long lVar1;
  
  this_00 = &(this->synth).impulse;
  (this->synth).impulse.eq.treble = 0.0;
  (this->synth).impulse.eq.cutoff = 0;
  (this->synth).impulse.eq.sample_rate = 0xac44;
  Blip_Impulse_::init(this_00,(EVP_PKEY_CTX *)&this->synth);
  lVar1 = 8;
  do {
    *(undefined8 *)((long)&this->oscs[0].delay + lVar1) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 200);
  Blip_Impulse_::volume_unit(this_00,0.0008333333333333334);
  memset(&this->addr_reg,0,0x84);
  lVar1 = 0x12;
  do {
    *(undefined8 *)((long)this->oscs + lVar1 + -0x12) = 0;
    *(undefined4 *)((long)this->oscs + lVar1 + -2) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd2);
  return;
}

Assistant:

Nes_Namco::Nes_Namco()
{
	output( NULL );
	volume( 1.0 );
	reset();
}